

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeTypeArray(ExpressionContext *ctx,SynTypeArray *syntax)

{
  TypeBase *value;
  TypeBase *type;
  SynTypeArray *syntax_local;
  ExpressionContext *ctx_local;
  
  value = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  if (value == (TypeBase *)0x0) {
    ctx_local = (ExpressionContext *)AnalyzeArrayIndex(ctx,syntax);
  }
  else {
    if (value == ctx->typeAuto) {
      anon_unknown.dwarf_6f1cc::Stop
                (ctx,&syntax->super_SynBase,"ERROR: cannot take typeid from auto type");
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeLiteral>(ctx);
    ExprTypeLiteral::ExprTypeLiteral
              ((ExprTypeLiteral *)ctx_local,&syntax->super_SynBase,ctx->typeTypeID,value);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeTypeArray(ExpressionContext &ctx, SynTypeArray *syntax)
{
	// It could be a typeid
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
	{
		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);
	}

	return AnalyzeArrayIndex(ctx, syntax);
}